

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

bool anon_unknown.dwarf_8df1c::IsBinaryOp(SynBinaryOpType type)

{
  bool local_9;
  SynBinaryOpType type_local;
  
  if ((type - SYN_BINARY_OP_SHL < 2) || (type - SYN_BINARY_OP_BIT_AND < 3)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool IsBinaryOp(SynBinaryOpType type)
	{
		switch(type)
		{
		case SYN_BINARY_OP_SHL:
		case SYN_BINARY_OP_SHR:
		case SYN_BINARY_OP_BIT_AND:
		case SYN_BINARY_OP_BIT_OR:
		case SYN_BINARY_OP_BIT_XOR:
			return true;
		default:
			break;
		}

		return false;
	}